

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O2

int lws_dll2_is_detached(lws_dll2 *d)

{
  ulong uVar1;
  
  if (d->owner != (lws_dll2_owner *)0x0) {
    return 0;
  }
  uVar1 = (ulong)d->next | (ulong)d->prev;
  if (uVar1 == 0) {
    return 1;
  }
  _lws_log(1,"%s: dll2 %p: detached but next %p, prev %p\n","lws_dll2_is_detached",d,d->next,d->prev
           ,uVar1);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/lws_dll2.c"
                ,0x32,"int lws_dll2_is_detached(const struct lws_dll2 *)");
}

Assistant:

int
lws_dll2_is_detached(const struct lws_dll2 *d)
{
	if (d->owner)
		return 0;

	if (d->next || d->prev) {
		lwsl_err("%s: dll2 %p: detached but next %p, prev %p\n",
				__func__, d, d->next, d->prev);
		/*
		 * New lws_dll2 objects and removed lws_dll2 objects
		 * have .owner, .next and .prev all set to NULL, so we
		 * can just check .owner to see if we are detached.
		 *
		 * We assert here if we encounter an lws_dll2 in the illegal
		 * state of NULL .owner, but non-NULL in .next or .prev,
		 * it's evidence of corruption, use-after-free, threads
		 * contending on accessing without locking etc.
		 */
		assert(0);
	}

	return 1;
}